

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::rc::Texture3D::Texture3D(Texture3D *this,deUint32 name)

{
  Texture::Texture(&this->super_Texture,name,TYPE_3D);
  (this->super_Texture).super_NamedObject._vptr_NamedObject = (_func_int **)&PTR__Texture3D_00c43ef8
  ;
  TextureLevelArray::TextureLevelArray(&this->m_levels);
  tcu::Texture3DView::Texture3DView(&this->m_view,0,(ConstPixelBufferAccess *)0x0);
  return;
}

Assistant:

Texture3D::Texture3D (deUint32 name)
	: Texture	(name, TYPE_3D)
	, m_view	(0, DE_NULL)
{
}